

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

file_time_type ghc::filesystem::last_write_time(path *p)

{
  int code;
  file_time_type fVar1;
  filesystem_error *this;
  error_code ec_00;
  error_code ec;
  string local_50;
  error_code local_30;
  
  local_30._M_value = 0;
  local_30._M_cat = (error_category *)std::_V2::system_category();
  fVar1 = last_write_time(p,&local_30);
  code = local_30._M_value;
  if (local_30._M_value == 0) {
    return (file_time_type)fVar1.__d.__r;
  }
  this = (filesystem_error *)__cxa_allocate_exception(0x90);
  detail::systemErrorText<int>(&local_50,code);
  ec_00._4_4_ = 0;
  ec_00._M_value = code;
  ec_00._M_cat = local_30._M_cat;
  filesystem_error::filesystem_error(this,&local_50,p,ec_00);
  __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE file_time_type last_write_time(const path& p)
{
    std::error_code ec;
    auto result = last_write_time(p, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), p, ec);
    }
    return result;
}